

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondEpsGen.h
# Opt level: O2

bool __thiscall
covenant::CondEpsGen<covenant::Sym>::addEpsTrans(CondEpsGen<covenant::Sym> *this,int qi,int qj)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int p;
  int iVar5;
  pointer pvVar6;
  int local_38;
  int local_34;
  anon_struct_12_3_f74832de local_30;
  
  local_38 = qj;
  local_34 = qi;
  if (qi < qj) {
    local_30.end = qj;
    local_30.start = qi;
    local_30.s = -1;
    std::
    vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
    ::emplace_back<covenant::CondEpsGen<covenant::Sym>::prod_info>(&this->decisions,&local_30);
    std::vector<int,_std::allocator<int>_>::push_back
              ((this->eps_preds).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + qj,&local_34);
    std::vector<int,_std::allocator<int>_>::push_back
              ((this->eps_succs).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_34,&local_38);
    for (iVar5 = 0; iVar4 = this->nprods, iVar5 < iVar4; iVar5 = iVar5 + 1) {
      pvVar6 = (this->produce_rev).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (long)iVar5 * (long)this->nstates + (long)local_34;
      uVar3 = 0;
      while( true ) {
        lVar1 = *(long *)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + 8) - lVar1 >> 2) <= (ulong)uVar3)
        break;
        addProd(this,*(int *)(lVar1 + (ulong)uVar3 * 4),iVar5,local_38);
        uVar3 = uVar3 + 1;
      }
    }
    for (iVar5 = 0; iVar5 < iVar4; iVar5 = iVar5 + 1) {
      pvVar6 = (this->produce_fwd).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
               (long)iVar5 * (long)this->nstates + (long)local_38;
      uVar3 = 0;
      while( true ) {
        lVar1 = *(long *)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + 8) - lVar1 >> 2) <= (ulong)uVar3)
        break;
        addProd(this,local_34,iVar5,*(int *)(lVar1 + (ulong)uVar3 * 4));
        uVar3 = uVar3 + 1;
      }
      iVar4 = this->nprods;
    }
    bVar2 = update_prods(this);
    return bVar2;
  }
  __assert_fail("qi < qj",
                "/workspace/llm4binary/github/license_all_cmakelists_25/caballa[P]covenant/include/refinement/CondEpsGen.h"
                ,0xcd,
                "bool covenant::CondEpsGen<covenant::Sym>::addEpsTrans(int, int) [EdgeSym = covenant::Sym]"
               );
}

Assistant:

bool addEpsTrans(int qi, int qj)
    {
      assert(qi < qj);
      
      // FIXME: Check that the epsilon transition doesn't
      // already (transitively) exist.

      // Record the decision
      decisions.push_back(mk_prod(qi, EPSSYM, qj));

      // Add it to the set of transitions
      eps_preds[qj].push_back(qi);
      eps_succs[qi].push_back(qj);
      
      // Extend any {qh, A, qi} to {qh, A, qj}
      for(int p = 0; p < nprods; p++)
      {
        vector<int>& rev(prod_rev(qi, p));
        for(unsigned int pi = 0; pi < rev.size(); pi++)
        {
          int qh = rev[pi];
          addProd(qh, p, qj);
        }
      }
      
      // Now extend any {qj, A, qk} to {qi, A, qk}
      for(int p = 0; p < nprods; p++)
      {
        vector<int>& fwd(prod_fwd(qj, p));
        for(unsigned int pi = 0; pi < fwd.size(); pi++)
        {
          int qk = fwd[pi];
          addProd(qi, p, qk); 
        }
      }
      
      return update_prods();
    }